

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seekforintruder.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  byte bVar2;
  pointer pcVar3;
  size_t __n;
  string *psVar4;
  pointer pbVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  address *a_1;
  istream *piVar9;
  ulong uVar10;
  long *plVar11;
  long lVar12;
  pointer paVar13;
  ostream *poVar14;
  long *plVar15;
  ulong *puVar16;
  pointer pbVar17;
  long lVar18;
  address *a_2;
  long lVar19;
  string *psVar20;
  pointer __x;
  ulong uVar21;
  size_type *psVar22;
  string addr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addrs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> a;
  string line;
  vector<sfi::data::address,_std::allocator<sfi::data::address>_> counts;
  string oct;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  octets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  addrsFin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string addr_1;
  ifstream stream;
  value_type local_5a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_588;
  string *local_570;
  string local_568;
  long *local_548;
  long local_540;
  long local_538;
  long lStack_530;
  undefined1 *local_528;
  ulong local_520;
  undefined1 local_518 [16];
  vector<sfi::data::address,_std::allocator<sfi::data::address>_> local_508;
  value_type local_4e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  string *local_4a8;
  pointer local_4a0;
  long *local_498;
  long local_490;
  long local_488;
  long lStack_480;
  long *local_478;
  long local_470;
  long local_468;
  long lStack_460;
  long *local_458;
  long local_450;
  long local_448;
  long lStack_440;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_438;
  undefined1 *local_418;
  long local_410;
  undefined1 local_408 [16];
  undefined1 *local_3f8 [2];
  undefined1 local_3e8 [16];
  string local_3d8;
  address local_3b8 [3];
  ios_base local_340 [264];
  long local_238 [65];
  
  std::ifstream::ifstream(local_238,argv[1],_S_in);
  local_528 = local_518;
  local_520 = 0;
  local_518[0] = 0;
  local_588.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_588.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_588.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_438.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_508.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_508.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_508.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    do {
      cVar6 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                              (char)(istream *)local_238);
      piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238,(string *)&local_528,cVar6);
      if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) {
        local_570 = local_588.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (local_588.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_588.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pbVar17 = local_588.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
            pcVar3 = (pbVar17->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_568,pcVar3,pcVar3 + pbVar17->_M_string_length);
            local_4c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_4c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_4c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)local_3b8,(string *)&local_568,_S_in);
            local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
            local_4e8._M_string_length = 0;
            local_4e8.field_2._M_local_buf[0] = '\0';
            while (piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                      ((istream *)local_3b8,(string *)&local_4e8,'.'),
                  ((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_4c8,&local_4e8);
            }
            uVar21 = (long)local_4c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_4c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5;
            if (uVar21 < 5) {
              if ((uVar21 == 4) || (uVar21 == 1)) {
                local_548 = &local_538;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_548,local_568._M_dataplus._M_p,
                           local_568._M_dataplus._M_p + local_568._M_string_length);
              }
              else {
                local_548 = &local_538;
                local_538 = CONCAT62(local_538._2_6_,0x30);
                local_540 = 1;
              }
            }
            else {
              local_3f8[0] = local_3e8;
              pcVar3 = ((local_4c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3f8,pcVar3,
                         pcVar3 + (local_4c8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
              std::__cxx11::string::append((char *)local_3f8);
              plVar11 = (long *)std::__cxx11::string::_M_append
                                          ((char *)local_3f8,
                                           (ulong)local_4c8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[1].
                                                  _M_dataplus._M_p);
              local_498 = &local_488;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_488 = *plVar15;
                lStack_480 = plVar11[3];
              }
              else {
                local_488 = *plVar15;
                local_498 = (long *)*plVar11;
              }
              local_490 = plVar11[1];
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_498);
              local_478 = &local_468;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_468 = *plVar15;
                lStack_460 = plVar11[3];
              }
              else {
                local_468 = *plVar15;
                local_478 = (long *)*plVar11;
              }
              local_470 = plVar11[1];
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_478,
                                           (ulong)local_4c8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                                  _M_dataplus._M_p);
              local_458 = &local_448;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_448 = *plVar15;
                lStack_440 = plVar11[3];
              }
              else {
                local_448 = *plVar15;
                local_458 = (long *)*plVar11;
              }
              local_450 = plVar11[1];
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_458);
              local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
              puVar16 = (ulong *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar16) {
                local_5a8.field_2._M_allocated_capacity = *puVar16;
                local_5a8.field_2._8_8_ = plVar11[3];
              }
              else {
                local_5a8.field_2._M_allocated_capacity = *puVar16;
                local_5a8._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_5a8._M_string_length = plVar11[1];
              *plVar11 = (long)puVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              plVar11 = (long *)std::__cxx11::string::_M_append
                                          ((char *)&local_5a8,
                                           (ulong)local_4c8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[3].
                                                  _M_dataplus._M_p);
              local_548 = &local_538;
              plVar15 = plVar11 + 2;
              if ((long *)*plVar11 == plVar15) {
                local_538 = *plVar15;
                lStack_530 = plVar11[3];
              }
              else {
                local_538 = *plVar15;
                local_548 = (long *)*plVar11;
              }
              local_540 = plVar11[1];
              *plVar11 = (long)plVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
                operator_delete(local_5a8._M_dataplus._M_p);
              }
              if (local_458 != &local_448) {
                operator_delete(local_458);
              }
              if (local_478 != &local_468) {
                operator_delete(local_478);
              }
              if (local_498 != &local_488) {
                operator_delete(local_498);
              }
              if (local_3f8[0] != local_3e8) {
                operator_delete(local_3f8[0]);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
              operator_delete(local_4e8._M_dataplus._M_p);
            }
            std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
            std::ios_base::~ios_base(local_340);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_4c8);
            std::__cxx11::string::operator=((string *)&local_568,(string *)&local_548);
            if (local_548 != &local_538) {
              operator_delete(local_548);
            }
            lVar12 = std::__cxx11::string::find((char)&local_568,0x2e);
            if (lVar12 == -1) {
              iVar8 = sfi::logic::getBase(&local_568);
              if (local_568._M_string_length < 0x20 && iVar8 == 2) {
                std::__cxx11::string::insert
                          ((ulong)&local_568,0,' ' - (char)local_568._M_string_length);
              }
              local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3d8,local_568._M_dataplus._M_p,
                         local_568._M_dataplus._M_p + local_568._M_string_length);
              sfi::logic::toDot(&local_3b8[0].addr,&local_3d8,iVar8);
              std::__cxx11::string::operator=((string *)&local_568,(string *)local_3b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8[0].addr._M_dataplus._M_p != &local_3b8[0].addr.field_2) {
                operator_delete(local_3b8[0].addr._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
                operator_delete(local_3d8._M_dataplus._M_p);
              }
              sfi::logic::dotToDotDec(&local_3b8[0].addr,&local_568,iVar8);
            }
            else {
              iVar8 = sfi::logic::getBase(&local_568);
              sfi::logic::dotToDotDec(&local_3b8[0].addr,&local_568,iVar8);
            }
            std::__cxx11::string::operator=((string *)&local_568,(string *)local_3b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8[0].addr._M_dataplus._M_p != &local_3b8[0].addr.field_2) {
              operator_delete(local_3b8[0].addr._M_dataplus._M_p);
            }
            bVar7 = sfi::logic::validateAddr(&local_568);
            if (bVar7) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_438,&local_568);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_568._M_dataplus._M_p != &local_568.field_2) {
              operator_delete(local_568._M_dataplus._M_p);
            }
            pbVar17 = pbVar17 + 1;
          } while (pbVar17 != local_570);
        }
        if (local_438.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_438.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_4a8 = local_438.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          pbVar17 = local_438.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar20 = local_438.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          do {
            bVar7 = sfi::logic::validateAddr(pbVar17);
            if (bVar7) {
              __n = pbVar17->_M_string_length;
              local_4a0 = local_508.
                          super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              if ((long)local_508.
                        super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_508.
                        super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                        _M_impl.super__Vector_impl_data._M_start != 0) {
                lVar18 = ((long)local_508.
                                super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_508.
                                super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x3333333333333333;
                local_570 = (string *)(pbVar17->_M_dataplus)._M_p;
                psVar22 = &((local_508.
                             super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>
                             ._M_impl.super__Vector_impl_data._M_start)->addr)._M_string_length;
                lVar19 = 0;
                lVar12 = 0;
                do {
                  if ((*psVar22 == __n) &&
                     ((__n == 0 ||
                      (iVar8 = bcmp((((value_type *)(psVar22 + -1))->_M_dataplus)._M_p,local_570,__n
                                   ), iVar8 == 0)))) {
                    if ((int)lVar12 != -1) {
                      local_4a0[lVar19 >> 0x20].count = local_4a0[lVar19 >> 0x20].count + 1;
                      psVar20 = local_4a8;
                      goto LAB_00103f9a;
                    }
                    break;
                  }
                  lVar12 = lVar12 + 1;
                  lVar19 = lVar19 + 0x100000000;
                  psVar22 = psVar22 + 5;
                } while (lVar18 + (ulong)(lVar18 == 0) != lVar12);
              }
              local_418 = local_408;
              pcVar3 = (pbVar17->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>((string *)&local_418,pcVar3,pcVar3 + __n);
              local_3b8[0].addr._M_dataplus._M_p = (pointer)&local_3b8[0].addr.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3b8,local_418,local_418 + local_410);
              local_3b8[0].count = 1;
              std::vector<sfi::data::address,_std::allocator<sfi::data::address>_>::
              emplace_back<sfi::data::address>(&local_508,local_3b8);
              psVar20 = local_4a8;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8[0].addr._M_dataplus._M_p != &local_3b8[0].addr.field_2) {
                operator_delete(local_3b8[0].addr._M_dataplus._M_p);
              }
              if (local_418 != local_408) {
                operator_delete(local_418);
              }
            }
LAB_00103f9a:
            pbVar17 = pbVar17 + 1;
          } while (pbVar17 != psVar20);
        }
        pbVar5 = local_588.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar17 = local_588.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar8 = 0;
        for (paVar13 = local_508.
                       super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            paVar13 !=
            local_508.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
            _M_impl.super__Vector_impl_data._M_finish; paVar13 = paVar13 + 1) {
          if (iVar8 < paVar13->count) {
            iVar8 = paVar13->count;
          }
        }
        psVar20 = local_588.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (local_588.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_588.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          do {
            pcVar3 = (psVar20->_M_dataplus)._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pcVar3 != &psVar20->field_2) {
              operator_delete(pcVar3);
            }
            psVar20 = psVar20 + 1;
          } while (psVar20 != pbVar5);
          local_588.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar17;
        }
        paVar13 = local_508.
                  super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (local_508.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_508.super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          __x = local_508.
                super__Vector_base<sfi::data::address,_std::allocator<sfi::data::address>_>._M_impl.
                super__Vector_impl_data._M_start;
          do {
            if (__x->count == iVar8) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_588,&__x->addr);
            }
            __x = __x + 1;
          } while (__x != paVar13);
        }
        pbVar5 = local_588.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar17 = local_588.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar20 = local_588.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar4 = local_588.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (local_588.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_588.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          uVar21 = (long)local_588.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_588.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5;
          lVar12 = 0x3f;
          if (uVar21 != 0) {
            for (; uVar21 >> lVar12 == 0; lVar12 = lVar12 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_588.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_588.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pbVar17,pbVar5);
          psVar20 = local_588.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          psVar4 = local_588.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        for (; pbVar17 = local_588.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
            psVar20 !=
            local_588.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; psVar20 = psVar20 + 1) {
          local_588.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = psVar4;
          bVar7 = sfi::logic::validateAddr(psVar20);
          if (bVar7) {
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,(psVar20->_M_dataplus)._M_p,
                                 psVar20->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14," ",1);
          }
          psVar4 = local_588.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_588.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar17;
        }
        local_588.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = psVar4;
        std::vector<sfi::data::address,_std::allocator<sfi::data::address>_>::~vector(&local_508);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_438);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_588);
        if (local_528 != local_518) {
          operator_delete(local_528);
        }
        std::ifstream::~ifstream(local_238);
        return 0;
      }
    } while (200 < local_520 - 100);
    local_5a8._M_string_length = 0;
    local_5a8.field_2._M_allocated_capacity =
         local_5a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    iVar8 = std::__cxx11::string::find((char *)&local_528,0x106058,0);
    cVar6 = (char)&local_5a8;
    if (iVar8 == -1) {
      if (local_520 != 0) {
        uVar21 = 0;
        do {
          if (local_528[uVar21] == '.' || (byte)(local_528[uVar21] - 0x30) < 10) {
            std::__cxx11::string::push_back(cVar6);
          }
          else {
            if ((char *)0x3 < local_5a8._M_string_length) {
              local_3b8[0].addr._M_dataplus._M_p = (pointer)&local_3b8[0].addr.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3b8,local_5a8._M_dataplus._M_p,
                         (char *)(local_5a8._M_string_length + (long)local_5a8._M_dataplus._M_p));
              if (*local_3b8[0].addr._M_dataplus._M_p == '.') {
                std::__cxx11::string::substr((ulong)&local_4e8,(ulong)local_3b8);
                std::__cxx11::string::operator=((string *)local_3b8,(string *)&local_4e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
                  operator_delete(local_4e8._M_dataplus._M_p);
                }
              }
              if (local_3b8[0].addr._M_dataplus._M_p[local_3b8[0].addr._M_string_length - 1] == '.')
              {
                std::__cxx11::string::substr((ulong)&local_4e8,(ulong)local_3b8);
                std::__cxx11::string::operator=((string *)local_3b8,(string *)&local_4e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
                  operator_delete(local_4e8._M_dataplus._M_p);
                }
              }
              iVar8 = std::__cxx11::string::find((char *)local_3b8,0x10604c,0);
              if (iVar8 == -1) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_588,&local_3b8[0].addr);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8[0].addr._M_dataplus._M_p != &local_3b8[0].addr.field_2) {
                operator_delete(local_3b8[0].addr._M_dataplus._M_p);
              }
            }
            std::__cxx11::string::_M_replace
                      ((ulong)&local_5a8,0,(char *)local_5a8._M_string_length,0x106021);
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 < local_520);
      }
    }
    else {
      uVar21 = (ulong)iVar8;
      if (uVar21 < local_520) {
        bVar7 = true;
        uVar10 = local_520;
LAB_0010370f:
        do {
          bVar2 = local_528[uVar21];
          if ((char)bVar2 < 'a') {
            if ((char)bVar2 < 'A') {
              if ((char)bVar2 < '0') {
                if (bVar2 == 0x2e) {
                  std::__cxx11::string::push_back(cVar6);
                  uVar21 = uVar21 + 1;
                  bVar7 = false;
                  uVar10 = local_520;
                  if (local_520 <= uVar21) goto LAB_001037da;
                  goto LAB_0010370f;
                }
              }
              else if (bVar2 < 0x3a) goto LAB_0010374a;
            }
            else if (bVar2 < 0x47) goto LAB_0010374a;
          }
          else if (bVar2 == 0x78 || bVar2 < 0x67) {
LAB_0010374a:
            std::__cxx11::string::push_back(cVar6);
            uVar10 = local_520;
          }
          uVar21 = uVar21 + 1;
        } while (uVar21 < uVar10);
        if (!bVar7) {
LAB_001037da:
          iVar8 = (int)local_5a8._M_string_length + 5;
          do {
            iVar1 = iVar8 + -6;
            iVar8 = iVar8 + -1;
          } while (local_5a8._M_dataplus._M_p[iVar1] != '.');
          std::__cxx11::string::substr((ulong)local_3b8,(ulong)&local_5a8);
          std::__cxx11::string::operator=((string *)&local_5a8,(string *)local_3b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8[0].addr._M_dataplus._M_p != &local_3b8[0].addr.field_2) {
            operator_delete(local_3b8[0].addr._M_dataplus._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_588,&local_5a8);
          goto LAB_00103835;
        }
      }
      std::__cxx11::string::substr((ulong)local_3b8,(ulong)&local_5a8);
      std::__cxx11::string::operator=((string *)&local_5a8,(string *)local_3b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8[0].addr._M_dataplus._M_p != &local_3b8[0].addr.field_2) {
        operator_delete(local_3b8[0].addr._M_dataplus._M_p);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_588,&local_5a8);
    }
LAB_00103835:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);
//    ifstream stream("/home/arkezar/intruder");
    string line;
    vector<string> addrs;
    vector<string> addrsFin;
    vector<sfi::data::address> counts;
//    int lineNo = 0;
    while (getline(stream, line)) {
//        lineNo+=1;
//        if(lineNo<=1200) {
            if (line.length() >= 100 && line.length() <= 300)
                sfi::logic::searchAddr(line, addrs);
//        } else {
//            return 0;
//        }
    }

    for (auto a : addrs) {
        a = sfi::logic::octetValidation(a);
        if(a.find('.')!=-1){
            a = sfi::logic::dotToDotDec(a,sfi::logic::getBase(a));
        } else {
            int base = sfi::logic::getBase(a);
            if(base == 2 && a.length() < 32) {
                a.insert(0, 32 - a.length(), '0');
            }
            a = sfi::logic::toDot(a,base);
            a = sfi::logic::dotToDotDec(a,base);
        }

        if(sfi::logic::validateAddr(a))
            addrsFin.push_back(a);
    }

    for(const auto& a : addrsFin){
        if(sfi::logic::validateAddr(a)) {
            int el = sfi::logic::elExists(counts, a);
            if (el != -1) {
                counts[el].increaseCount();
            } else {
                counts.push_back(sfi::data::address(a, 1));
            }
        }
    }

    int maxOcc = 0;
    for (const sfi::data::address& a : counts) {
        if(a.count > maxOcc)
            maxOcc = a.count;
    }

    addrs.clear();

    for (const sfi::data::address& a : counts) {
        if(a.count == maxOcc)
            addrs.push_back(a.addr);
    }

    std::sort(addrs.begin(),addrs.end());

    for(const string& a : addrs)
        if(sfi::logic::validateAddr(a))
            cout << a << " ";

    return 0;
}